

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O1

char * json::load<pointer_obj_var2>(char *in,size_t len,pointer_obj_var2 *t,int options)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char cVar8;
  int iVar9;
  property *__i;
  property *ppVar10;
  size_t sVar11;
  property *ppVar12;
  char *pcVar13;
  char *pcVar14;
  property *ppVar15;
  ulong uVar16;
  property *ppVar17;
  ulong uVar18;
  ulong uVar19;
  property *__last;
  size_t sVar20;
  bool bVar21;
  size_t props_size;
  LoadObject serializer;
  prop_map props;
  size_t local_2608;
  int local_25fc;
  LoadObject local_25f8;
  pointer_obj_var2 *local_25c0;
  property local_25b8;
  property local_2598 [14];
  char *local_23d8;
  size_t asStack_23d0 [3];
  property local_23b8 [284];
  
  local_2608 = 0;
  cVar8 = *in;
  pcVar13 = in;
  while ((cVar8 != '\0' && (iVar9 = isspace((int)cVar8), iVar9 != 0))) {
    cVar8 = pcVar13[1];
    pcVar13 = pcVar13 + 1;
  }
  if (*pcVar13 == '{') {
    pcVar13 = load_props(pcVar13 + 1,in + len,(prop_map *)&local_25b8,&local_2608);
    sVar11 = local_2608;
    if (*pcVar13 == '}') {
      local_25fc = options;
      local_25c0 = t;
      if (local_2608 != 0) {
        __last = &local_25b8 + local_2608;
        lVar3 = 0x3f;
        if (local_2608 != 0) {
          for (; local_2608 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<json::property*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(json::property_const&,json::property_const&)>>
                  (&local_25b8,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_json::property_&,_const_json::property_&)>)
                   0x14cd1b);
        if ((long)sVar11 < 0x11) {
          if (sVar11 != 1) {
            ppVar10 = local_2598;
            ppVar17 = &local_25b8;
            do {
              ppVar15 = ppVar10;
              uVar2 = (ppVar15->param).len;
              sVar11 = local_25b8.param.len;
              if (uVar2 < local_25b8.param.len) {
                sVar11 = uVar2;
              }
              if (sVar11 != 0) {
                uVar18 = 0;
                do {
                  cVar8 = ppVar17[1].param.str[uVar18];
                  cVar1 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str + uVar18)
                  ;
                  if (cVar1 != cVar8) {
                    bVar21 = cVar8 < cVar1;
                    goto LAB_00154bd7;
                  }
                  uVar18 = uVar18 + 1;
                } while (sVar11 != uVar18);
              }
              bVar21 = uVar2 < local_25b8.param.len;
LAB_00154bd7:
              if (bVar21) {
                local_25f8.props = (prop_map *)(ppVar15->param).str;
                local_25f8.props_size = (ppVar15->param).len;
                local_25f8.current = (size_t)(ppVar15->value).str;
                local_25f8._24_8_ = (ppVar15->value).len;
                sVar20 = (long)ppVar15 - (long)&local_25b8;
                memmove((void *)((long)ppVar17 + (0x40 - sVar20)),&local_25b8,sVar20);
                local_25b8.param.str = (char *)local_25f8.props;
                local_25b8.param.len = local_25f8.props_size;
                local_25b8.value.str = (char *)local_25f8.current;
                local_25b8.value.len = local_25f8._24_8_;
              }
              else {
                pcVar14 = ppVar17[1].param.str;
                local_25f8.props = (prop_map *)(ppVar15->value).str;
                local_25f8.props_size = (ppVar15->value).len;
                uVar18 = (ppVar17->param).len;
                uVar16 = uVar18;
                if (uVar2 < uVar18) {
                  uVar16 = uVar2;
                }
                if (uVar16 != 0) {
                  uVar19 = 0;
                  do {
                    cVar8 = (ppVar17->param).str[uVar19];
                    if (cVar8 != pcVar14[uVar19]) {
                      bVar21 = pcVar14[uVar19] < cVar8;
                      goto LAB_00154c65;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                bVar21 = uVar2 < uVar18;
LAB_00154c65:
                ppVar10 = ppVar15;
                ppVar12 = ppVar15;
                if (bVar21) {
                  do {
                    ppVar10 = ppVar17;
                    pcVar4 = (ppVar10->param).str;
                    sVar11 = (ppVar10->param).len;
                    sVar5 = (ppVar10->value).len;
                    (ppVar12->value).str = (ppVar10->value).str;
                    (ppVar12->value).len = sVar5;
                    (ppVar12->param).str = pcVar4;
                    (ppVar12->param).len = sVar11;
                    uVar18 = ppVar10[-1].param.len;
                    uVar16 = uVar18;
                    if (uVar2 < uVar18) {
                      uVar16 = uVar2;
                    }
                    if (uVar16 != 0) {
                      uVar19 = 0;
                      do {
                        cVar8 = ppVar10[-1].param.str[uVar19];
                        if (cVar8 != pcVar14[uVar19]) {
                          bVar21 = pcVar14[uVar19] < cVar8;
                          goto LAB_00154cc3;
                        }
                        uVar19 = uVar19 + 1;
                      } while (uVar16 != uVar19);
                    }
                    bVar21 = uVar2 < uVar18;
LAB_00154cc3:
                    ppVar12 = ppVar10;
                    ppVar17 = ppVar10 + -1;
                  } while (bVar21);
                }
                (ppVar10->param).str = pcVar14;
                (ppVar10->param).len = uVar2;
                (ppVar10->value).str = (char *)local_25f8.props;
                (ppVar10->value).len = local_25f8.props_size;
              }
              ppVar10 = ppVar15 + 1;
              ppVar17 = ppVar15;
            } while (ppVar15 + 1 != __last);
          }
        }
        else {
          sVar20 = 0x20;
          ppVar10 = &local_25b8;
          do {
            ppVar17 = (property *)((long)&local_25b8.param.str + sVar20);
            uVar2 = *(ulong *)((long)local_2598 + (sVar20 - 0x18));
            sVar11 = local_25b8.param.len;
            if (uVar2 < local_25b8.param.len) {
              sVar11 = uVar2;
            }
            if (sVar11 != 0) {
              uVar18 = 0;
              do {
                cVar8 = (ppVar17->param).str[uVar18];
                cVar1 = *(char *)((long)&(((property *)local_25b8.param.str)->param).str + uVar18);
                if (cVar1 != cVar8) {
                  bVar21 = cVar8 < cVar1;
                  goto LAB_00154978;
                }
                uVar18 = uVar18 + 1;
              } while (sVar11 != uVar18);
            }
            bVar21 = uVar2 < local_25b8.param.len;
LAB_00154978:
            if (bVar21) {
              local_25f8.props = (prop_map *)(ppVar17->param).str;
              local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar20 - 0x18));
              local_25f8.current = *(undefined8 *)((long)local_2598 + (sVar20 - 0x10));
              local_25f8._24_8_ = *(size_t *)((long)local_2598 + (sVar20 - 8));
              memmove(local_2598,&local_25b8,sVar20);
              local_25b8.param.str = (char *)local_25f8.props;
              local_25b8.param.len = local_25f8.props_size;
              local_25b8.value.str = (char *)local_25f8.current;
              local_25b8.value.len = local_25f8._24_8_;
            }
            else {
              pcVar14 = (ppVar17->param).str;
              local_25f8.props = *(prop_map **)((long)local_2598 + (sVar20 - 0x10));
              local_25f8.props_size = *(size_t *)((long)local_2598 + (sVar20 - 8));
              uVar18 = (ppVar10->param).len;
              uVar16 = uVar18;
              if (uVar2 < uVar18) {
                uVar16 = uVar2;
              }
              if (uVar16 != 0) {
                uVar19 = 0;
                do {
                  cVar8 = (ppVar10->param).str[uVar19];
                  if (cVar8 != pcVar14[uVar19]) {
                    bVar21 = pcVar14[uVar19] < cVar8;
                    goto LAB_00154a01;
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              bVar21 = uVar2 < uVar18;
LAB_00154a01:
              ppVar15 = ppVar17;
              ppVar12 = ppVar17;
              if (bVar21) {
                do {
                  ppVar15 = ppVar10;
                  pcVar4 = (ppVar15->param).str;
                  sVar11 = (ppVar15->param).len;
                  sVar5 = (ppVar15->value).len;
                  (ppVar12->value).str = (ppVar15->value).str;
                  (ppVar12->value).len = sVar5;
                  (ppVar12->param).str = pcVar4;
                  (ppVar12->param).len = sVar11;
                  uVar18 = ppVar15[-1].param.len;
                  uVar16 = uVar18;
                  if (uVar2 < uVar18) {
                    uVar16 = uVar2;
                  }
                  if (uVar16 != 0) {
                    uVar19 = 0;
                    do {
                      cVar8 = ppVar15[-1].param.str[uVar19];
                      if (cVar8 != pcVar14[uVar19]) {
                        bVar21 = pcVar14[uVar19] < cVar8;
                        goto LAB_00154a5f;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  bVar21 = uVar2 < uVar18;
LAB_00154a5f:
                  ppVar10 = ppVar15 + -1;
                  ppVar12 = ppVar15;
                } while (bVar21);
              }
              (ppVar15->param).str = pcVar14;
              (ppVar15->param).len = uVar2;
              (ppVar15->value).str = (char *)local_25f8.props;
              (ppVar15->value).len = local_25f8.props_size;
            }
            sVar20 = sVar20 + 0x20;
            ppVar10 = ppVar17;
          } while (sVar20 != 0x200);
          ppVar10 = local_23b8;
          do {
            pcVar14 = (ppVar10->param).str;
            uVar2 = (ppVar10->param).len;
            pcVar4 = (ppVar10->value).str;
            sVar11 = (ppVar10->value).len;
            uVar18 = ppVar10[-1].param.len;
            uVar16 = uVar18;
            if (uVar2 < uVar18) {
              uVar16 = uVar2;
            }
            if (uVar16 != 0) {
              uVar19 = 0;
              do {
                cVar8 = ppVar10[-1].param.str[uVar19];
                if (cVar8 != pcVar14[uVar19]) {
                  bVar21 = pcVar14[uVar19] < cVar8;
                  goto LAB_00154adf;
                }
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            bVar21 = uVar2 < uVar18;
LAB_00154adf:
            ppVar17 = ppVar10 + -1;
            ppVar15 = ppVar10;
            ppVar12 = ppVar10;
            if (bVar21) {
              do {
                ppVar15 = ppVar17;
                pcVar6 = (ppVar15->param).str;
                sVar5 = (ppVar15->param).len;
                sVar7 = (ppVar15->value).len;
                (ppVar12->value).str = (ppVar15->value).str;
                (ppVar12->value).len = sVar7;
                (ppVar12->param).str = pcVar6;
                (ppVar12->param).len = sVar5;
                uVar18 = ppVar15[-1].param.len;
                uVar16 = uVar18;
                if (uVar2 < uVar18) {
                  uVar16 = uVar2;
                }
                if (uVar16 != 0) {
                  uVar19 = 0;
                  do {
                    cVar8 = ppVar15[-1].param.str[uVar19];
                    if (cVar8 != pcVar14[uVar19]) {
                      bVar21 = pcVar14[uVar19] < cVar8;
                      goto LAB_00154b3f;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                bVar21 = uVar2 < uVar18;
LAB_00154b3f:
                ppVar17 = ppVar15 + -1;
                ppVar12 = ppVar15;
              } while (bVar21);
            }
            (ppVar15->param).str = pcVar14;
            (ppVar15->param).len = uVar2;
            (ppVar15->value).str = pcVar4;
            (ppVar15->value).len = sVar11;
            ppVar10 = ppVar10 + 1;
          } while (ppVar10 != __last);
        }
      }
      local_25f8.props = (prop_map *)&local_25b8;
      local_25f8.props_size = local_2608;
      local_25f8.current = 0;
      local_25f8.options = local_25fc;
      local_25f8.error_pos = (char *)0x0;
      local_25f8._prev_name = "";
      local_25f8.start = in;
      bVar21 = serialize<json::LoadObject>(&local_25f8,local_25c0);
      if (!bVar21) {
        return local_25f8.error_pos;
      }
      if (local_25f8.current < local_25f8.props_size) {
        return (&local_25b8)[local_25f8.current].param.str;
      }
      cVar8 = pcVar13[1];
      while( true ) {
        pcVar14 = pcVar13 + 1;
        if (cVar8 == '\0') {
          return pcVar14;
        }
        iVar9 = isspace((int)cVar8);
        if (iVar9 == 0) break;
        cVar8 = pcVar13[2];
        pcVar13 = pcVar14;
      }
      return pcVar14;
    }
  }
  return pcVar13 + -1;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}